

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary_tests.cc
# Opt level: O3

void __thiscall
lf::mesh::utils::test::meshFunctionBinary_Subtraction_Test::TestBody
          (meshFunctionBinary_Subtraction_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>
  *this_00;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>
  *pMVar2;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>
  *pMVar3;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>
  *pMVar4;
  MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>
  *pMVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  this_01;
  void *pvVar6;
  bool bVar7;
  RefEl ref_el;
  RefElType type;
  int iVar8;
  dim_t dVar9;
  undefined4 extraout_var;
  Scalar *pSVar10;
  Scalar *pSVar11;
  Scalar *pSVar12;
  Scalar *pSVar13;
  Scalar *pSVar14;
  AssertHelperData *pAVar15;
  undefined8 *puVar16;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar17;
  Matrix<double,_2,_2,_0,_2,_2> *pMVar18;
  undefined8 extraout_RAX;
  Scalar *pSVar19;
  undefined8 uVar20;
  string *in_RCX;
  long lVar21;
  ulong uVar22;
  string *psVar23;
  Index col;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this_02;
  DenseCoeffsBase<Eigen::Array<double,__1,__1,_0,__1,__1>,_1> *this_03;
  _func_int *p_Var24;
  int in_R9D;
  Index IVar25;
  long lVar26;
  bool bVar27;
  shared_ptr<lf::mesh::Mesh> sVar28;
  undefined1 auVar29 [16];
  AssertionResult AVar30;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>_>
  a;
  QuadRule qr;
  MatrixXd global_points;
  vector<double,_std::allocator<double>_> vals1;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  vals2_1;
  shared_ptr<lf::mesh::Mesh> mesh;
  vector<double,_std::allocator<double>_> vals2;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  vals2_9;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  vals1_9;
  stringstream ss;
  undefined1 local_4b8 [8];
  Entity local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  double *local_498;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [32];
  Matrix<double,_2,_2,_0,_2,_2> local_448;
  string *local_428;
  string local_420;
  double *local_400;
  Index IStack_3f8;
  undefined8 local_3f0;
  string *local_3e8;
  undefined8 *local_3e0;
  Scalar local_3d8;
  undefined8 uStack_3d0;
  test *local_3c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c0;
  Matrix<double,__1,__1,_0,__1,__1> local_3b8;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_398;
  vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_380;
  undefined1 local_368 [8];
  Entity EStack_360;
  long local_358;
  Index IStack_350;
  double *local_348;
  Index IStack_340;
  undefined8 local_338;
  _Alloc_hider *local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  OperatorSubtraction local_1c0 [8];
  undefined **local_1b8;
  undefined **local_1a8;
  OperatorSubtraction local_198 [8];
  undefined **local_190;
  undefined **local_180;
  OperatorSubtraction local_170 [8];
  undefined **local_168;
  undefined **local_158;
  OperatorSubtraction local_148 [8];
  undefined **local_140;
  undefined **local_130;
  OperatorSubtraction local_120 [8];
  undefined **local_118;
  undefined **local_108;
  OperatorSubtraction local_f8 [8];
  undefined **local_f0;
  undefined **local_e0;
  OperatorSubtraction local_d0 [8];
  undefined **local_c8;
  undefined **local_b8;
  OperatorSubtraction local_a8 [8];
  undefined **local_a0;
  undefined **local_90;
  OperatorSubtraction local_80 [8];
  undefined **local_78;
  undefined **local_68;
  OperatorSubtraction local_58 [8];
  undefined **local_50;
  undefined **local_40;
  
  sVar28 = test_utils::GenerateHybrid2DTestMesh((test_utils *)&local_3c8,0,1.0);
  local_50 = &PTR__MeshFunctionGlobal_0046f280;
  local_40 = &PTR__MeshFunctionGlobal_0046f2b0;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))
                      (local_3c8,0,
                       sVar28.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    in_RCX = (string *)(puVar16 + auVar29._8_8_);
    local_3e8 = in_RCX;
    do {
      this_00 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>
                 *)*puVar16;
      local_3e0 = puVar16;
      iVar8 = (*this_00->_vptr_MeshFunctionGlobal[4])(this_00);
      quad::make_QuadRule((QuadRule *)local_4b8,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:57:5)>
      ::operator()((vector<double,_std::allocator<double>_> *)local_368,this_00,&local_4b0,
                   (MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:59:24)>
      ::operator()((vector<double,_std::allocator<double>_> *)&local_420,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:59:24)>
                    *)this_00,&local_4b0,(MatrixXd *)in_RCX);
      internal::OperatorSubtraction::operator()<double,_double>
                ((vector<double,_std::allocator<double>_> *)&local_448,local_58,
                 (vector<double,_std::allocator<double>_> *)local_368,
                 (vector<double,_std::allocator<double>_> *)&local_420,0);
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      if (local_368 != (undefined1  [8])0x0) {
        operator_delete((void *)local_368,local_358 - (long)local_368);
      }
      iVar8 = (*this_00->_vptr_MeshFunctionGlobal[4])(this_00);
      dVar9 = base::internal::DimensionImpl((RefElType)iVar8);
      if ((pointer)local_4a8._M_allocated_capacity != (pointer)(ulong)dVar9) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_368);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_358,"mismatch between entity dimension and local.rows()",0x32);
        paVar1 = &local_420.field_2;
        local_420._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_420,"e.RefEl().Dimension() == local.rows()","");
        pAVar15 = (AssertHelperData *)(local_488 + 0x10);
        local_488._0_8_ = pAVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_420,(string *)local_488,0x50,(string *)local_468);
        if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
          operator_delete((void *)local_468._0_8_,CONCAT71(local_468._17_7_,local_468[0x10]) + 1);
        }
        if ((AssertHelperData *)local_488._0_8_ != pAVar15) {
          operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != paVar1) {
          operator_delete(local_420._M_dataplus._M_p,
                          CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                            local_420.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        local_420.field_2._M_allocated_capacity._0_4_ = 0x736c6166;
        local_420.field_2._M_allocated_capacity._4_2_ = 0x65;
        local_420._M_string_length = 5;
        local_488._0_8_ = pAVar15;
        local_420._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                   ,"");
        local_468._8_8_ = 0;
        local_468[0x10] = '\0';
        local_468._0_8_ = local_468 + 0x10;
        base::AssertionFailed(&local_420,(string *)local_488,0x50,(string *)local_468);
        goto LAB_0012500a;
      }
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)&local_3b8,local_4a8._8_8_);
      iVar8 = (*this_00->_vptr_MeshFunctionGlobal[3])(this_00);
      in_RCX = *(string **)CONCAT44(extraout_var,iVar8);
      (**(code **)((long)&in_RCX->field_2 + 8))
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_488,
                 (undefined8 *)CONCAT44(extraout_var,iVar8),&local_4b0);
      if (0 < (long)local_4a8._8_8_) {
        lVar21 = 0;
        do {
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_420,
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_488,lVar21);
          local_338 = local_3f0;
          local_358 = CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                        local_420.field_2._M_allocated_capacity._0_4_));
          local_348 = local_400;
          IStack_340 = IStack_3f8;
          IStack_350 = local_420.field_2._8_8_;
          local_368 = (undefined1  [8])local_420._M_dataplus._M_p;
          EStack_360._vptr_Entity = (_func_int **)local_420._M_string_length;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_3d8 = *pSVar10;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_428 = (string *)*pSVar10;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_468._0_8_ = local_3d8 * (double)local_428 - *pSVar10;
          if (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows == local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)&local_3b8,
                       (iterator)
                       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows,(double *)local_468);
          }
          else {
            *(undefined8 *)
             local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows = local_468._0_8_;
            local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows + 8;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < (long)local_4a8._8_8_);
      }
      free((void *)local_488._0_8_);
      if (local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[1] !=
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0]) {
        uVar22 = 0;
        do {
          local_420._M_dataplus._M_p =
               (pointer)(*(double *)
                          ((long)local_448.
                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                                 m_storage.m_data.array[0] + uVar22 * 8) -
                        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data[uVar22]);
          local_488._0_8_ = &DAT_3ddb7cdfd9d7bdbb;
          in_RCX = &local_420;
          testing::internal::CmpHelperLT<double,double>
                    ((internal *)local_368,"vals1[i] - vals2[i]","1e-10",(double *)&local_420,
                     (double *)local_488);
          if ((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )local_368[0] ==
              (DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )0x0) {
            testing::Message::Message((Message *)&local_420);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_420._M_dataplus._M_p + 0x10),"i=",2);
            std::ostream::operator<<(local_420._M_dataplus._M_p + 0x10,(int)uVar22);
            p_Var24 = (_func_int *)0x3c7fe6;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                EStack_360._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = *EStack_360._vptr_Entity;
            }
            in_RCX = (string *)0x1a;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_488,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x1a,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_488,(Message *)&local_420);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_488);
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_420._M_dataplus._M_p + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              EStack_360._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&EStack_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         EStack_360._vptr_Entity);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < (ulong)((long)local_448.
                                        super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                                        .m_storage.m_data.array[1] -
                                  (long)local_448.
                                        super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                                        .m_storage.m_data.array[0] >> 3));
      }
      if (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data != (double *)0x0) {
        operator_delete(local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data,
                        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols -
                        (long)local_3b8.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data);
      }
      if ((undefined1 *)
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] != (undefined1 *)0x0) {
        operator_delete((void *)local_448.
                                super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                                m_storage.m_data.array[0],
                        (long)local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                              .m_storage.m_data.array[2] -
                        (long)local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                              .m_storage.m_data.array[0]);
      }
      free(local_498);
      free(local_4b0._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
  local_78 = &PTR__MeshFunctionGlobal_0046f340;
  local_68 = &PTR__MeshFunctionGlobal_0046f370;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    in_RCX = (string *)(puVar16 + auVar29._8_8_);
    local_3e8 = in_RCX;
    do {
      pMVar2 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>
                *)*puVar16;
      local_3e0 = puVar16;
      iVar8 = (*pMVar2->_vptr_MeshFunctionGlobal[4])(pMVar2);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:60:37)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,pMVar2,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:62:5)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)local_4b8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>
                    *)pMVar2,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4b8;
      internal::OperatorSubtraction::operator()
                ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_488,local_80,
                 (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_420,
                 (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_4b8,0);
      pvVar6 = (void *)CONCAT71(local_4b8._1_7_,local_4b8[0]);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_4a8._M_allocated_capacity - (long)pvVar6);
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:135:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:135:7)>
                    *)pMVar2,&EStack_360,(MatrixXd *)in_RCX);
      if (local_488._8_8_ != local_488._0_8_) {
        psVar23 = (string *)0x0;
        do {
          local_468._0_8_ = (long *)0x2;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].rows()","vals2[i].rows()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
LAB_00122708:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            if ((long *)local_468._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_468._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_420._M_dataplus._M_p,
                              CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                                local_420.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_420._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_00122784;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          local_468._0_8_ = (long *)0x1;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].cols()","vals2[i].cols()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
            goto LAB_00122708;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          IVar25 = 0;
          bVar7 = true;
          local_428 = psVar23;
          do {
            bVar27 = bVar7;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_488._0_8_ + (long)psVar23 * 0x10),IVar25,0);
            local_3d8 = *pSVar11;
            uStack_3d0 = 0;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_420._M_dataplus._M_p + (long)psVar23 * 0x10),IVar25,0);
            local_468._0_8_ = ABS(local_3d8 - *pSVar11);
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_468;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4b8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_468,(double *)&local_448);
            if (local_4b8[0] == 0) {
              testing::Message::Message((Message *)local_468);
              p_Var24 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4b0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var24 = *local_4b0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_448,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var24);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_448,(Message *)local_468);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
              if ((long *)local_468._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_468._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            IVar25 = 1;
            bVar7 = false;
          } while (bVar27);
          psVar23 = (string *)
                    ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                     *)&local_428->_M_dataplus)->
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                  ).
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  .m_data)->
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )._M_head_impl + 1);
        } while (psVar23 < (string *)((long)(local_488._8_8_ - local_488._0_8_) >> 4));
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
LAB_00122784:
  local_a0 = &PTR__MeshFunctionGlobal_0046f3a0;
  local_90 = &PTR__MeshFunctionGlobal_0046f370;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    in_RCX = (string *)(puVar16 + auVar29._8_8_);
    local_3e8 = in_RCX;
    do {
      pMVar3 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>
                *)*puVar16;
      local_3e0 = puVar16;
      iVar8 = (*pMVar3->_vptr_MeshFunctionGlobal[4])(pMVar3);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:64:5)>
      ::operator()((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_420,pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:62:5)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)local_4b8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>
                    *)pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4b8;
      internal::OperatorSubtraction::operator()
                ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_488,local_a8,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_420,
                 (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_4b8,0);
      pvVar6 = (void *)CONCAT71(local_4b8._1_7_,local_4b8[0]);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_4a8._M_allocated_capacity - (long)pvVar6);
      }
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_420);
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:135:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:135:7)>
                    *)pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      if (local_488._8_8_ != local_488._0_8_) {
        psVar23 = (string *)0x0;
        do {
          local_468._0_8_ = (long *)0x2;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].rows()","vals2[i].rows()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
LAB_00122b6a:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            if ((long *)local_468._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_468._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_420._M_dataplus._M_p,
                              CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                                local_420.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_420._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_00122be6;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          local_468._0_8_ = (long *)0x1;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].cols()","vals2[i].cols()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
            goto LAB_00122b6a;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          IVar25 = 0;
          bVar7 = true;
          local_428 = psVar23;
          do {
            bVar27 = bVar7;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_488._0_8_ + (long)psVar23 * 0x10),IVar25,0);
            local_3d8 = *pSVar11;
            uStack_3d0 = 0;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_420._M_dataplus._M_p + (long)psVar23 * 0x10),IVar25,0);
            local_468._0_8_ = ABS(local_3d8 - *pSVar11);
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_468;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4b8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_468,(double *)&local_448);
            if (local_4b8[0] == 0) {
              testing::Message::Message((Message *)local_468);
              p_Var24 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4b0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var24 = *local_4b0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_448,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var24);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_448,(Message *)local_468);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
              if ((long *)local_468._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_468._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            IVar25 = 1;
            bVar7 = false;
          } while (bVar27);
          psVar23 = (string *)
                    ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                     *)&local_428->_M_dataplus)->
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                  ).
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  .m_data)->
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )._M_head_impl + 1);
        } while (psVar23 < (string *)((long)(local_488._8_8_ - local_488._0_8_) >> 4));
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
LAB_00122be6:
  local_c8 = &PTR__MeshFunctionGlobal_0046f340;
  local_b8 = &PTR__MeshFunctionGlobal_0046f3d0;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    in_RCX = (string *)(puVar16 + auVar29._8_8_);
    local_3e8 = in_RCX;
    do {
      pMVar2 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>
                *)*puVar16;
      local_3e0 = puVar16;
      iVar8 = (*pMVar2->_vptr_MeshFunctionGlobal[4])(pMVar2);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:60:37)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,pMVar2,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:65:45)>
      ::operator()((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_4b8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>
                    *)pMVar2,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4b8;
      internal::OperatorSubtraction::operator()
                ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_488,local_d0,
                 (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_420,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_4b8,0);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_4b8);
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:135:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:135:7)>
                    *)pMVar2,&EStack_360,(MatrixXd *)in_RCX);
      if (local_488._8_8_ != local_488._0_8_) {
        psVar23 = (string *)0x0;
        do {
          local_468._0_8_ = (long *)0x2;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].rows()","vals2[i].rows()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
LAB_00122fcf:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            if ((long *)local_468._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_468._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_420._M_dataplus._M_p,
                              CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                                local_420.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_420._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_0012304b;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          local_468._0_8_ = (long *)0x1;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].cols()","vals2[i].cols()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
            goto LAB_00122fcf;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          IVar25 = 0;
          bVar7 = true;
          local_428 = psVar23;
          do {
            bVar27 = bVar7;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_488._0_8_ + (long)psVar23 * 0x10),IVar25,0);
            local_3d8 = *pSVar11;
            uStack_3d0 = 0;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_420._M_dataplus._M_p + (long)psVar23 * 0x10),IVar25,0);
            local_468._0_8_ = ABS(local_3d8 - *pSVar11);
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_468;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4b8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_468,(double *)&local_448);
            if (local_4b8[0] == 0) {
              testing::Message::Message((Message *)local_468);
              p_Var24 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4b0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var24 = *local_4b0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_448,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var24);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_448,(Message *)local_468);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
              if ((long *)local_468._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_468._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            IVar25 = 1;
            bVar7 = false;
          } while (bVar27);
          psVar23 = (string *)
                    ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                     *)&local_428->_M_dataplus)->
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                  ).
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  .m_data)->
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )._M_head_impl + 1);
        } while (psVar23 < (string *)((long)(local_488._8_8_ - local_488._0_8_) >> 4));
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
LAB_0012304b:
  local_f0 = &PTR__MeshFunctionGlobal_0046f3a0;
  local_e0 = &PTR__MeshFunctionGlobal_0046f3d0;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    local_3e8 = (string *)(puVar16 + auVar29._8_8_);
    do {
      pMVar3 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>
                *)*puVar16;
      iVar8 = (*pMVar3->_vptr_MeshFunctionGlobal[4])(pMVar3);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:64:5)>
      ::operator()((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_420,pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:65:45)>
      ::operator()((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_4b8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>
                    *)pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4b8;
      internal::OperatorSubtraction::operator()
                ((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_488,local_f8,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_420,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_4b8,0);
      local_3e0 = puVar16;
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_4b8);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_420);
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:135:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:135:7)>
                    *)pMVar3,&EStack_360,(MatrixXd *)in_RCX);
      if (local_488._8_8_ != local_488._0_8_) {
        psVar23 = (string *)0x0;
        pAVar15 = (AssertHelperData *)local_488._0_8_;
        do {
          local_468._0_8_ = (&pAVar15->file)[(long)psVar23 * 3];
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].rows()","vals2[i].rows()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
LAB_0012345a:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            if ((long *)local_468._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_468._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_420._M_dataplus._M_p,
                              CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                                local_420.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_420._M_dataplus._M_p);
            }
            std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)local_488);
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_001234c9;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          local_468._0_8_ = *(undefined8 *)(local_488._0_8_ + (long)psVar23 * 0x18 + 0x10);
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].cols()","vals2[i].cols()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
            goto LAB_0012345a;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          pAVar15 = (AssertHelperData *)local_488._0_8_;
          local_428 = psVar23;
          if (0 < *(long *)(local_488._0_8_ + (long)psVar23 * 0x18 + 8)) {
            lVar21 = 0;
            do {
              if (0 < *(Index *)((long)&pAVar15->line + (long)psVar23 * 3 * 8)) {
                this_02 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          ((((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            &pAVar15->type)->m_storage).m_data.array + (long)psVar23 * 3);
                lVar26 = 0;
                do {
                  pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::
                            operator()(this_02,lVar21,lVar26);
                  local_3d8 = *pSVar12;
                  uStack_3d0 = 0;
                  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                       (local_420._M_dataplus._M_p + (long)psVar23 * 0x10),lVar21,
                                       lVar26);
                  local_468._0_8_ = ABS(local_3d8 - *pSVar11);
                  local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
                  testing::internal::CmpHelperLT<double,double>
                            ((internal *)local_4b8,"std::abs(vals1[i](r, c) - vals2[i](r, c))",
                             "1e-10",(double *)local_468,(double *)&local_448);
                  if (local_4b8[0] == 0) {
                    testing::Message::Message((Message *)local_468);
                    p_Var24 = (_func_int *)0x3c7fe6;
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4b0._vptr_Entity !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      p_Var24 = *local_4b0._vptr_Entity;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_448,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                               ,0x2b,(char *)p_Var24);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_448,(Message *)local_468);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
                    if ((long *)local_468._0_8_ != (long *)0x0) {
                      (**(code **)(*(long *)local_468._0_8_ + 8))();
                    }
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_4b0._vptr_Entity !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_4b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4b0._vptr_Entity);
                  }
                  lVar26 = lVar26 + 1;
                  this_02 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            (local_488._0_8_ + (long)psVar23 * 0x18);
                  pAVar15 = (AssertHelperData *)local_488._0_8_;
                } while (lVar26 < *(long *)(this_02 + 0x10));
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < (long)(&pAVar15->file)[(long)psVar23 * 3]);
          }
          psVar23 = (string *)
                    ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                     *)&local_428->_M_dataplus)->
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                  ).
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  .m_data)->
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )._M_head_impl + 1);
          in_RCX = (string *)((local_488._8_8_ - (long)pAVar15 >> 3) * -0x5555555555555555);
        } while (psVar23 <= in_RCX && (long)in_RCX - (long)psVar23 != 0);
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_488);
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
LAB_001234c9:
  local_118 = &PTR__MeshFunctionGlobal_0046f400;
  local_108 = &PTR__MeshFunctionGlobal_0046f430;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    in_RCX = (string *)(puVar16 + auVar29._8_8_);
    local_3e8 = in_RCX;
    do {
      pMVar4 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>
                *)*puVar16;
      local_3e0 = puVar16;
      iVar8 = (*pMVar4->_vptr_MeshFunctionGlobal[4])(pMVar4);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:70:5)>
      ::operator()((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:72:24)>
      ::operator()((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                    *)local_4b8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>
                    *)pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4b8;
      internal::OperatorSubtraction::operator()
                ((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_488,local_120,
                 (vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_420,
                 (vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_4b8,0);
      pvVar6 = (void *)CONCAT71(local_4b8._1_7_,local_4b8[0]);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_4a8._M_allocated_capacity - (long)pvVar6);
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:135:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:135:7)>
                    *)pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      if (local_488._8_8_ != local_488._0_8_) {
        psVar23 = (string *)0x0;
        do {
          local_468._0_8_ = (long *)0x2;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].rows()","vals2[i].rows()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
LAB_001238c0:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            if ((long *)local_468._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_468._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_420._M_dataplus._M_p,
                              CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                                local_420.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_420._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_0012393c;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          local_468._0_8_ = (long *)0x1;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].cols()","vals2[i].cols()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
            goto LAB_001238c0;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          IVar25 = 0;
          bVar7 = true;
          local_428 = psVar23;
          do {
            bVar27 = bVar7;
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_488._0_8_ + (long)psVar23 * 0x10),IVar25,0);
            local_3d8 = *pSVar13;
            uStack_3d0 = 0;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_420._M_dataplus._M_p + (long)psVar23 * 0x10),IVar25,0);
            local_468._0_8_ = ABS(local_3d8 - *pSVar11);
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_468;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4b8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_468,(double *)&local_448);
            if (local_4b8[0] == 0) {
              testing::Message::Message((Message *)local_468);
              p_Var24 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4b0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var24 = *local_4b0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_448,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var24);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_448,(Message *)local_468);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
              if ((long *)local_468._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_468._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            IVar25 = 1;
            bVar7 = false;
          } while (bVar27);
          psVar23 = (string *)
                    ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                     *)&local_428->_M_dataplus)->
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                  ).
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  .m_data)->
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )._M_head_impl + 1);
        } while (psVar23 < (string *)((long)(local_488._8_8_ - local_488._0_8_) >> 4));
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
LAB_0012393c:
  local_140 = &PTR__MeshFunctionGlobal_0046f460;
  local_130 = &PTR__MeshFunctionGlobal_0046f430;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    in_RCX = (string *)(puVar16 + auVar29._8_8_);
    local_3e8 = in_RCX;
    do {
      pMVar5 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>
                *)*puVar16;
      local_3e0 = puVar16;
      iVar8 = (*pMVar5->_vptr_MeshFunctionGlobal[4])(pMVar5);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:76:5)>
      ::operator()((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_420,pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:72:24)>
      ::operator()((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                    *)local_4b8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>
                    *)pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4b8;
      internal::OperatorSubtraction::operator()
                ((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_488,local_148,
                 (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_420,
                 (vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_4b8,0);
      pvVar6 = (void *)CONCAT71(local_4b8._1_7_,local_4b8[0]);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_4a8._M_allocated_capacity - (long)pvVar6);
      }
      std::
      vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_420);
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:135:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:135:7)>
                    *)pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      if (local_488._8_8_ != local_488._0_8_) {
        psVar23 = (string *)0x0;
        do {
          local_468._0_8_ = (long *)0x2;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].rows()","vals2[i].rows()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
LAB_00123d22:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            if ((long *)local_468._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_468._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_420._M_dataplus._M_p,
                              CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                                local_420.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_420._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_00123d9e;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          local_468._0_8_ = (long *)0x1;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].cols()","vals2[i].cols()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
            goto LAB_00123d22;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          IVar25 = 0;
          bVar7 = true;
          local_428 = psVar23;
          do {
            bVar27 = bVar7;
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_488._0_8_ + (long)psVar23 * 0x10),IVar25,0);
            local_3d8 = *pSVar13;
            uStack_3d0 = 0;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_420._M_dataplus._M_p + (long)psVar23 * 0x10),IVar25,0);
            local_468._0_8_ = ABS(local_3d8 - *pSVar11);
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_468;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4b8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_468,(double *)&local_448);
            if (local_4b8[0] == 0) {
              testing::Message::Message((Message *)local_468);
              p_Var24 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4b0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var24 = *local_4b0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_448,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var24);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_448,(Message *)local_468);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
              if ((long *)local_468._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_468._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            IVar25 = 1;
            bVar7 = false;
          } while (bVar27);
          psVar23 = (string *)
                    ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                     *)&local_428->_M_dataplus)->
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                  ).
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  .m_data)->
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )._M_head_impl + 1);
        } while (psVar23 < (string *)((long)(local_488._8_8_ - local_488._0_8_) >> 4));
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
LAB_00123d9e:
  local_168 = &PTR__MeshFunctionGlobal_0046f400;
  local_158 = &PTR__MeshFunctionGlobal_0046f490;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    in_RCX = (string *)(puVar16 + auVar29._8_8_);
    local_3e8 = in_RCX;
    do {
      pMVar4 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>
                *)*puVar16;
      local_3e0 = puVar16;
      iVar8 = (*pMVar4->_vptr_MeshFunctionGlobal[4])(pMVar4);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:70:5)>
      ::operator()((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:78:24)>
      ::operator()((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                    *)local_4b8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>
                    *)pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4b8;
      internal::OperatorSubtraction::operator()
                ((vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)local_488,local_170,
                 (vector<Eigen::Array<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Array<double,_2,_1,_0,_2,_1>_>_>
                  *)&local_420,
                 (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)local_4b8,0);
      std::
      vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)local_4b8);
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:135:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:135:7)>
                    *)pMVar4,&EStack_360,(MatrixXd *)in_RCX);
      if (local_488._8_8_ != local_488._0_8_) {
        psVar23 = (string *)0x0;
        do {
          local_468._0_8_ = (long *)0x2;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].rows()","vals2[i].rows()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
LAB_00124187:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            if ((long *)local_468._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_468._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_420._M_dataplus._M_p,
                              CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                                local_420.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_420._M_dataplus._M_p);
            }
            if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
              operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
            }
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_00124203;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          local_468._0_8_ = (long *)0x1;
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].cols()","vals2[i].cols()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
            goto LAB_00124187;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          IVar25 = 0;
          bVar7 = true;
          local_428 = psVar23;
          do {
            bVar27 = bVar7;
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Array<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_488._0_8_ + (long)psVar23 * 0x10),IVar25,0);
            local_3d8 = *pSVar13;
            uStack_3d0 = 0;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                 (local_420._M_dataplus._M_p + (long)psVar23 * 0x10),IVar25,0);
            local_468._0_8_ = ABS(local_3d8 - *pSVar11);
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
            in_RCX = (string *)local_468;
            testing::internal::CmpHelperLT<double,double>
                      ((internal *)local_4b8,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                       (double *)local_468,(double *)&local_448);
            if (local_4b8[0] == 0) {
              testing::Message::Message((Message *)local_468);
              p_Var24 = (_func_int *)0x3c7fe6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_4b0._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                p_Var24 = *local_4b0._vptr_Entity;
              }
              in_RCX = (string *)0x2b;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_448,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                         ,0x2b,(char *)p_Var24);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_448,(Message *)local_468);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
              if ((long *)local_468._0_8_ != (long *)0x0) {
                (**(code **)(*(long *)local_468._0_8_ + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            IVar25 = 1;
            bVar7 = false;
          } while (bVar27);
          psVar23 = (string *)
                    ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                     *)&local_428->_M_dataplus)->
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                  ).
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  .m_data)->
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )._M_head_impl + 1);
        } while (psVar23 < (string *)((long)(local_488._8_8_ - local_488._0_8_) >> 4));
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      if ((AssertHelperData *)local_488._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_488._0_8_,local_478._0_8_ - local_488._0_8_);
      }
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
LAB_00124203:
  local_190 = &PTR__MeshFunctionGlobal_0046f460;
  local_180 = &PTR__MeshFunctionGlobal_0046f490;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  puVar16 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    local_3e8 = (string *)(puVar16 + auVar29._8_8_);
    do {
      pMVar5 = (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>
                *)*puVar16;
      iVar8 = (*pMVar5->_vptr_MeshFunctionGlobal[4])(pMVar5);
      quad::make_QuadRule((QuadRule *)local_368,(RefEl)(RefElType)iVar8,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:76:5)>
      ::operator()((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_420,pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:78:24)>
      ::operator()((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                    *)local_4b8,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>
                    *)pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      in_RCX = (string *)local_4b8;
      internal::OperatorSubtraction::operator()
                ((vector<Eigen::Array<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                  *)local_488,local_198,
                 (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_420,
                 (vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)local_4b8,0);
      local_3e0 = puVar16;
      std::
      vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)local_4b8);
      std::
      vector<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                 *)&local_420);
      MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:135:7)>
      ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:135:7)>
                    *)pMVar5,&EStack_360,(MatrixXd *)in_RCX);
      if (local_488._8_8_ != local_488._0_8_) {
        psVar23 = (string *)0x0;
        pAVar15 = (AssertHelperData *)local_488._0_8_;
        do {
          local_468._0_8_ = (&pAVar15->file)[(long)psVar23 * 3];
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 9.88131291682493e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].rows()","vals2[i].rows()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x27;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
LAB_00124612:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
            if ((long *)local_468._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_468._0_8_ + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b0._vptr_Entity);
            }
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_420._M_dataplus._M_p,
                              CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                                local_420.field_2._M_allocated_capacity._0_4_)) -
                              (long)local_420._M_dataplus._M_p);
            }
            std::
            vector<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::~vector((vector<Eigen::Array<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                       *)local_488);
            free(local_348);
            free(EStack_360._vptr_Entity);
            goto LAB_00124681;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          local_468._0_8_ = *(undefined8 *)(local_488._0_8_ + (long)psVar23 * 0x18 + 0x10);
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = 4.94065645841247e-324;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_4b8,"vals1[i].cols()","vals2[i].cols()",(long *)local_468,
                     (long *)&local_448);
          if (local_4b8[0] == 0) {
            testing::Message::Message((Message *)local_468);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_4b0._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *local_4b0._vptr_Entity;
            }
            in_RCX = (string *)0x28;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_448,(Message *)local_468);
            goto LAB_00124612;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_4b0._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0._vptr_Entity);
          }
          pAVar15 = (AssertHelperData *)local_488._0_8_;
          local_428 = psVar23;
          if (0 < *(long *)(local_488._0_8_ + (long)psVar23 * 0x18 + 8)) {
            lVar21 = 0;
            do {
              if (0 < *(Index *)((long)&pAVar15->line + (long)psVar23 * 3 * 8)) {
                this_03 = (DenseCoeffsBase<Eigen::Array<double,__1,__1,_0,__1,__1>,_1> *)
                          ((((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            &pAVar15->type)->m_storage).m_data.array + (long)psVar23 * 3);
                lVar26 = 0;
                do {
                  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1>::
                            operator()(this_03,lVar21,lVar26);
                  local_3d8 = *pSVar14;
                  uStack_3d0 = 0;
                  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                                       (local_420._M_dataplus._M_p + (long)psVar23 * 0x10),lVar21,
                                       lVar26);
                  local_468._0_8_ = ABS(local_3d8 - *pSVar11);
                  local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[0] = (double)&DAT_3ddb7cdfd9d7bdbb;
                  testing::internal::CmpHelperLT<double,double>
                            ((internal *)local_4b8,"std::abs(vals1[i](r, c) - vals2[i](r, c))",
                             "1e-10",(double *)local_468,(double *)&local_448);
                  if (local_4b8[0] == 0) {
                    testing::Message::Message((Message *)local_468);
                    p_Var24 = (_func_int *)0x3c7fe6;
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4b0._vptr_Entity !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      p_Var24 = *local_4b0._vptr_Entity;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_448,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                               ,0x2b,(char *)p_Var24);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_448,(Message *)local_468);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
                    if ((long *)local_468._0_8_ != (long *)0x0) {
                      (**(code **)(*(long *)local_468._0_8_ + 8))();
                    }
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_4b0._vptr_Entity !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_4b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4b0._vptr_Entity);
                  }
                  lVar26 = lVar26 + 1;
                  this_03 = (DenseCoeffsBase<Eigen::Array<double,__1,__1,_0,__1,__1>,_1> *)
                            (local_488._0_8_ + (long)psVar23 * 0x18);
                  pAVar15 = (AssertHelperData *)local_488._0_8_;
                } while (lVar26 < *(long *)(this_03 + 0x10));
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 < (long)(&pAVar15->file)[(long)psVar23 * 3]);
          }
          psVar23 = (string *)
                    ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                     *)&local_428->_M_dataplus)->
                                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                  ).
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  .
                                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  .m_data)->
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )._M_head_impl + 1);
          in_RCX = (string *)((local_488._8_8_ - (long)pAVar15 >> 3) * -0x5555555555555555);
        } while (psVar23 <= in_RCX && (long)in_RCX - (long)psVar23 != 0);
      }
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      std::
      vector<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Array<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                 *)local_488);
      free(local_348);
      free(EStack_360._vptr_Entity);
      puVar16 = local_3e0 + 1;
    } while ((string *)puVar16 != local_3e8);
  }
LAB_00124681:
  local_1b8 = &PTR__MeshFunctionGlobal_0046f2e0;
  local_1a8 = &PTR__MeshFunctionGlobal_0046f310;
  auVar29 = (**(code **)(*(long *)local_3c8 + 0x10))(local_3c8,0);
  psVar23 = auVar29._0_8_;
  if (auVar29._8_8_ != 0) {
    local_1e0 = &psVar23->_M_dataplus + auVar29._8_8_;
    do {
      this_01._M_head_impl =
           (((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              *)&(psVar23->_M_dataplus)._M_p)->
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      ref_el.type_ = (**(code **)(*(long *)this_01._M_head_impl + 0x20))(this_01._M_head_impl);
      quad::make_QuadRule((QuadRule *)local_4b8,ref_el,5);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:83:24)>
      ::operator()((vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                    *)local_368,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:83:24)>
                    *)this_01._M_head_impl,&local_4b0,(MatrixXd *)in_RCX);
      MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:84:37)>
      ::operator()((vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                    *)&local_420,
                   (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:84:37)>
                    *)this_01._M_head_impl,&local_4b0,(MatrixXd *)in_RCX);
      internal::OperatorSubtraction::operator()
                (&local_380,local_1c0,
                 (vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                  *)local_368,
                 (vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                  *)&local_420,0);
      if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
        operator_delete(local_420._M_dataplus._M_p,
                        CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                          local_420.field_2._M_allocated_capacity._0_4_)) -
                        (long)local_420._M_dataplus._M_p);
      }
      if (local_368 != (undefined1  [8])0x0) {
        operator_delete((void *)local_368,local_358 - (long)local_368);
      }
      type = (**(code **)(*(long *)this_01._M_head_impl + 0x20))(this_01._M_head_impl);
      dVar9 = base::internal::DimensionImpl(type);
      if ((pointer)local_4a8._M_allocated_capacity != (pointer)(ulong)dVar9) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_368);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_358,"mismatch between entity dimension and local.rows()",0x32);
        paVar1 = &local_420.field_2;
        local_420._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_420,"e.RefEl().Dimension() == local.rows()","");
        pAVar15 = (AssertHelperData *)(local_488 + 0x10);
        local_488._0_8_ = pAVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_420,(string *)local_488,0x50,(string *)local_468);
        if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
          operator_delete((void *)local_468._0_8_,CONCAT71(local_468._17_7_,local_468[0x10]) + 1);
        }
        if ((AssertHelperData *)local_488._0_8_ != pAVar15) {
          operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != paVar1) {
          operator_delete(local_420._M_dataplus._M_p,
                          CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                            local_420.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        local_420.field_2._M_allocated_capacity._0_4_ = 0x736c6166;
        local_420.field_2._M_allocated_capacity._4_2_ = 0x65;
        local_420._M_string_length = 5;
        local_488._0_8_ = pAVar15;
        local_420._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                   ,"");
        local_468._8_8_ = 0;
        local_468[0x10] = '\0';
        local_468._0_8_ = local_468 + 0x10;
        base::AssertionFailed(&local_420,(string *)local_488,0x50,(string *)local_468);
LAB_0012500a:
        std::__cxx11::string::~string((string *)local_468);
        std::__cxx11::string::~string((string *)local_488);
        std::__cxx11::string::~string((string *)&local_420);
        abort();
      }
      local_398.
      super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.
      super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_2,_2,_0,_2,_2> *)0x0;
      local_398.
      super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_2,_2,_0,_2,_2> *)0x0;
      std::
      vector<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
      ::reserve(&local_398,local_4a8._8_8_);
      local_3e8 = psVar23;
      puVar16 = (undefined8 *)
                (**(code **)(*(long *)this_01._M_head_impl + 0x18))(this_01._M_head_impl);
      in_RCX = (string *)*puVar16;
      (**(code **)((long)&in_RCX->field_2 + 8))(&local_3b8,puVar16,&local_4b0);
      if (0 < (long)local_4a8._8_8_) {
        IVar25 = 0;
        do {
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_420,
                     &local_3b8,IVar25);
          local_338 = local_3f0;
          local_358 = CONCAT26(local_420.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_420.field_2._M_allocated_capacity._4_2_,
                                        local_420.field_2._M_allocated_capacity._0_4_));
          local_348 = local_400;
          IStack_340 = IStack_3f8;
          IStack_350 = local_420.field_2._8_8_;
          local_368 = (undefined1  [8])local_420._M_dataplus._M_p;
          EStack_360._vptr_Entity = (_func_int **)local_420._M_string_length;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_3d8 = *pSVar10;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_468._0_8_ = local_3d8 * *pSVar10;
          local_488._0_8_ = local_468;
          local_488._8_8_ = (AssertHelperData *)0x0;
          local_478._0_8_ = (pointer)0x1;
          local_478._8_8_ = 1;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_3d8 = *pSVar10;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_1c8 = local_3d8 * *pSVar10 + -1.0;
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_488,
                               &local_1c8);
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_3d8 = *pSVar10;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_428 = (string *)*pSVar10;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,0);
          local_1d0 = local_3d8 * (double)local_428 - *pSVar10;
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                              (pCVar17,&local_1d0);
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_3d8 = *pSVar10;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_428 = (string *)*pSVar10;
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                  *)local_368,1);
          local_1d8 = local_3d8 * (double)local_428 - *pSVar10;
          pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                              (pCVar17,&local_1d8);
          pMVar18 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished
                              (pCVar17);
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[0] = (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[0];
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[1] = (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[1];
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[2] = (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[2];
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
          array[3] = (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[3];
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished
                    ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_488);
          if (local_398.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_398.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<double,2,2,0,2,2>,std::allocator<Eigen::Matrix<double,2,2,0,2,2>>>
            ::_M_realloc_insert<Eigen::Matrix<double,2,2,0,2,2>>
                      ((vector<Eigen::Matrix<double,2,2,0,2,2>,std::allocator<Eigen::Matrix<double,2,2,0,2,2>>>
                        *)&local_398,
                       (iterator)
                       local_398.
                       super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_448);
          }
          else {
            ((local_398.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[2]
                 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2];
            ((local_398.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[3]
                 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[3];
            ((local_398.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[0]
                 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[0];
            ((local_398.
              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[1]
                 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[1];
            local_398.
            super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_398.
                 super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          IVar25 = IVar25 + 1;
        } while (IVar25 < (long)local_4a8._8_8_);
      }
      free(local_3b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      if (local_380.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_380.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_428 = (string *)0x0;
        do {
          local_420._M_dataplus._M_p = (pointer)0x2;
          local_488._0_8_ = (AssertHelperData *)0x2;
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)local_368,"vals1[i].rows()","vals2[i].rows()",(long *)&local_420,
                     (long *)local_488);
          if ((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )local_368[0] ==
              (DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )0x0) {
            testing::Message::Message((Message *)&local_420);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                EStack_360._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *EStack_360._vptr_Entity;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_488,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x27,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_488,(Message *)&local_420);
LAB_00124de1:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_488);
            if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_420._M_dataplus._M_p + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                EStack_360._vptr_Entity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&EStack_360,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           EStack_360._vptr_Entity);
            }
            if (local_398.
                super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_398.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_398.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_398.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_380.
                super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_380.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_380.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_380.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            free(local_498);
            free(local_4b0._vptr_Entity);
            goto LAB_00124e66;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              EStack_360._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&EStack_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         EStack_360._vptr_Entity);
          }
          local_420._M_dataplus._M_p = (pointer)0x2;
          local_488._0_8_ = (AssertHelperData *)0x2;
          AVar30 = testing::internal::CmpHelperEQ<long,long>
                             ((internal *)local_368,"vals1[i].cols()","vals2[i].cols()",
                              (long *)&local_420,(long *)local_488);
          uVar20 = AVar30._0_8_;
          if ((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )local_368[0] ==
              (DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               )0x0) {
            testing::Message::Message((Message *)&local_420);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                EStack_360._vptr_Entity ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              p_Var24 = (_func_int *)0x3c7fe6;
            }
            else {
              p_Var24 = *EStack_360._vptr_Entity;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_488,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x28,(char *)p_Var24);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_488,(Message *)&local_420);
            goto LAB_00124de1;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              EStack_360._vptr_Entity !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&EStack_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         EStack_360._vptr_Entity);
            uVar20 = extraout_RAX;
          }
          uVar20 = CONCAT71((int7)((ulong)uVar20 >> 8),1);
          IVar25 = 0;
          do {
            local_3e0 = (undefined8 *)CONCAT44(local_3e0._4_4_,(int)uVar20);
            col = 0;
            bVar7 = true;
            do {
              bVar27 = bVar7;
              psVar23 = local_428;
              pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                                   (local_380.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)local_428),
                                   IVar25,col);
              local_3d8 = *pSVar19;
              uStack_3d0 = 0;
              pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                                   (local_398.
                                    super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)psVar23),
                                   IVar25,col);
              local_420._M_dataplus._M_p = (pointer)ABS(local_3d8 - *pSVar19);
              local_488._0_8_ = &DAT_3ddb7cdfd9d7bdbb;
              in_RCX = &local_420;
              testing::internal::CmpHelperLT<double,double>
                        ((internal *)local_368,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                         (double *)&local_420,(double *)local_488);
              if ((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                   )local_368[0] ==
                  (DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                   )0x0) {
                testing::Message::Message((Message *)&local_420);
                p_Var24 = (_func_int *)0x3c7fe6;
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    EStack_360._vptr_Entity !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  p_Var24 = *EStack_360._vptr_Entity;
                }
                in_RCX = (string *)0x2b;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_488,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                           ,0x2b,(char *)p_Var24);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_488,(Message *)&local_420);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_488);
                if ((long *)local_420._M_dataplus._M_p != (long *)0x0) {
                  (**(code **)(*(long *)local_420._M_dataplus._M_p + 8))();
                }
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  EStack_360._vptr_Entity !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&EStack_360,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             EStack_360._vptr_Entity);
              }
              col = 1;
              bVar7 = false;
            } while (bVar27);
            IVar25 = 1;
            uVar20 = 0;
          } while (((ulong)local_3e0 & 1) != 0);
          local_428 = (string *)
                      ((long)&(((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&(((BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                       *)&local_428->_M_dataplus)->
                                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                    ).
                                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                    .
                                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                    .m_data)->
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              )._M_head_impl + 1);
        } while (local_428 <
                 (string *)
                 ((long)local_380.
                        super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_380.
                        super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if (local_398.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_398.
                        super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_398.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_398.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      psVar23 = local_3e8;
      if (local_380.
          super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_380.
                        super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_380.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_380.
                              super__Vector_base<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_std::allocator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      free(local_498);
      free(local_4b0._vptr_Entity);
      psVar23 = (string *)&psVar23->_M_string_length;
    } while (psVar23 != (string *)local_1e0);
  }
LAB_00124e66:
  a.a_.value_.x_ = (X)0x0;
  a._0_4_ = mfXB;
  a.b_.value_.x_ = (X)0xffffffff;
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>>,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>>
            (local_3c8,(Mesh *)((ulong)mfXA << 0x20),a,
             (MeshFunctionConstant<lf::mesh::utils::test::X>)0x0,in_R9D);
  if (local_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0);
  }
  return;
}

Assistant:

TEST(meshFunctionBinary, Subtraction) {
  auto mesh = lf::mesh::test_utils::GenerateHybrid2DTestMesh(0);

  auto sub = mfA - mfB;
  checkMeshFunctionEqual(*mesh, sub, MeshFunctionGlobal([](auto x) {
    return x[0] * x[0] - x[0];
  }));

  auto mfVecDif = MeshFunctionGlobal(
      [](auto x) { return Eigen::Vector2d(0., x[1] - 2 * x[0]); });
  checkMeshFunctionEqual(*mesh, mfVectorA - mfVectorB, mfVecDif);
  checkMeshFunctionEqual(*mesh, mfVectorA_dynamic - mfVectorB, mfVecDif);
  checkMeshFunctionEqual(*mesh, mfVectorA - mfVectorB_dynamic, mfVecDif);
  checkMeshFunctionEqual(*mesh, mfVectorA_dynamic - mfVectorB_dynamic,
                         mfVecDif);
  checkMeshFunctionEqual(*mesh, mfArrayA - mfArrayB, mfVecDif);
  checkMeshFunctionEqual(*mesh, mfArrayA_dynamic - mfArrayB, mfVecDif);
  checkMeshFunctionEqual(*mesh, mfArrayA - mfArrayB_dynamic, mfVecDif);
  checkMeshFunctionEqual(*mesh, mfArrayA_dynamic - mfArrayB_dynamic, mfVecDif);

  auto subMatrix = mfMatrixA - mfMatrixB;
  checkMeshFunctionEqual(*mesh, subMatrix, MeshFunctionGlobal([](auto x) {
    return (Eigen::Matrix2d() << x[0] * x[0], x[0] * x[1] - 1,
            x[0] * x[1] - x[0], x[1] * x[1] - x[1])
        .finished();
  }));

  auto xSub = mfXA - mfXB;
  checkMeshFunctionEqual(*mesh, xSub, MeshFunctionConstant(X(-1)));
}